

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

void uv__finish_close(uv_handle_t *handle)

{
  uv_signal_t *sh;
  uv_handle_t *handle_local;
  
  if ((handle->flags & 1) == 0) {
    __assert_fail("handle->flags & UV_HANDLE_CLOSING",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                  ,0x125,"void uv__finish_close(uv_handle_t *)");
  }
  if ((handle->flags & 2) == 0) {
    handle->flags = handle->flags | 2;
    switch(handle->type) {
    case UV_ASYNC:
    case UV_CHECK:
    case UV_FS_EVENT:
    case UV_FS_POLL:
    case UV_IDLE:
    case UV_POLL:
    case UV_PREPARE:
    case UV_PROCESS:
    case UV_TIMER:
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                    ,0x14e,"void uv__finish_close(uv_handle_t *)");
    case UV_NAMED_PIPE:
    case UV_TCP:
    case UV_TTY:
      uv__stream_destroy((uv_stream_t *)handle);
      break;
    case UV_UDP:
      uv__udp_finish_close((uv_udp_t *)handle);
      break;
    case UV_SIGNAL:
      if (*(uint *)((long)&handle[1].next_closing + 4) < *(uint *)&handle[1].next_closing) {
        handle->flags = handle->flags ^ 2;
        uv__make_close_pending(handle);
        return;
      }
    }
    if ((((handle->flags & 8) != 0) &&
        (handle->flags = handle->flags & 0xfffffff7, (handle->flags & 1) == 0)) &&
       ((handle->flags & 4) != 0)) {
      handle->loop->active_handles = handle->loop->active_handles - 1;
    }
    uv__queue_remove(&handle->handle_queue);
    if (handle->close_cb != (uv_close_cb)0x0) {
      (*handle->close_cb)(handle);
    }
    return;
  }
  __assert_fail("!(handle->flags & UV_HANDLE_CLOSED)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/core.c"
                ,0x126,"void uv__finish_close(uv_handle_t *)");
}

Assistant:

static void uv__finish_close(uv_handle_t* handle) {
  uv_signal_t* sh;

  /* Note: while the handle is in the UV_HANDLE_CLOSING state now, it's still
   * possible for it to be active in the sense that uv__is_active() returns
   * true.
   *
   * A good example is when the user calls uv_shutdown(), immediately followed
   * by uv_close(). The handle is considered active at this point because the
   * completion of the shutdown req is still pending.
   */
  assert(handle->flags & UV_HANDLE_CLOSING);
  assert(!(handle->flags & UV_HANDLE_CLOSED));
  handle->flags |= UV_HANDLE_CLOSED;

  switch (handle->type) {
    case UV_PREPARE:
    case UV_CHECK:
    case UV_IDLE:
    case UV_ASYNC:
    case UV_TIMER:
    case UV_PROCESS:
    case UV_FS_EVENT:
    case UV_FS_POLL:
    case UV_POLL:
      break;

    case UV_SIGNAL:
      /* If there are any caught signals "trapped" in the signal pipe,
       * we can't call the close callback yet. Reinserting the handle
       * into the closing queue makes the event loop spin but that's
       * okay because we only need to deliver the pending events.
       */
      sh = (uv_signal_t*) handle;
      if (sh->caught_signals > sh->dispatched_signals) {
        handle->flags ^= UV_HANDLE_CLOSED;
        uv__make_close_pending(handle);  /* Back into the queue. */
        return;
      }
      break;

    case UV_NAMED_PIPE:
    case UV_TCP:
    case UV_TTY:
      uv__stream_destroy((uv_stream_t*)handle);
      break;

    case UV_UDP:
      uv__udp_finish_close((uv_udp_t*)handle);
      break;

    default:
      assert(0);
      break;
  }

  uv__handle_unref(handle);
  uv__queue_remove(&handle->handle_queue);

  if (handle->close_cb) {
    handle->close_cb(handle);
  }
}